

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormatSymbols::DecimalFormatSymbols
          (DecimalFormatSymbols *this,Locale *loc,NumberingSystem *ns,UErrorCode *status)

{
  UnicodeString *local_98;
  UnicodeString *local_78;
  UnicodeString *local_40;
  UErrorCode *status_local;
  NumberingSystem *ns_local;
  Locale *loc_local;
  DecimalFormatSymbols *this_local;
  
  memset(this,0,8);
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DecimalFormatSymbols_004f1700;
  local_40 = (UnicodeString *)&this->field_0x8;
  do {
    UnicodeString::UnicodeString(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != &this->fNoSymbol);
  UnicodeString::UnicodeString(&this->fNoSymbol);
  Locale::Locale(&this->locale,loc);
  this->currPattern = (char16_t *)0x0;
  local_78 = (UnicodeString *)&this->field_0x978;
  do {
    UnicodeString::UnicodeString(local_78);
    local_78 = local_78 + 1;
  } while (local_78 != (UnicodeString *)&this->field_0xa38);
  local_98 = (UnicodeString *)&this->field_0xa38;
  do {
    UnicodeString::UnicodeString(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != (UnicodeString *)&this->fIsCustomCurrencySymbol);
  initialize(this,&this->locale,status,'\0',ns);
  return;
}

Assistant:

DecimalFormatSymbols::DecimalFormatSymbols(const Locale& loc, const NumberingSystem& ns, UErrorCode& status)
        : UObject(), locale(loc), currPattern(NULL) {
    initialize(locale, status, FALSE, &ns);
}